

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SelectWeapon
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClassActor *type;
  bool bVar1;
  VMValue *pVVar2;
  AWeapon *this_00;
  bool bVar3;
  bool local_72;
  bool local_6f;
  int u_3;
  int u_2;
  int u_1;
  AWeapon *weaponitem;
  int u;
  bool selectPriority;
  int flags;
  MetaClass *cls;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc14,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc14,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_6f = true;
  if (this != (AActor *)0x0) {
    local_6f = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_6f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc14,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc15,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_72 = true;
    if (type != (PClassActor *)0x0) {
      local_72 = PClass::IsDescendantOf((PClass *)type,AWeapon::RegistrationInfo.MyClass);
    }
    if (local_72 != false) {
      if (numparam < 3) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xc16,
                        "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        u = (pVVar2->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xc16,
                        "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        u = param[2].field_0.i;
      }
      bVar3 = (u & 1U) == 0;
      if (((bVar3) && (type == (PClassActor *)0x0)) || (this->player == (player_t *)0x0)) {
        if (numret < 1) {
          param_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0xc1c,
                          "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,0);
          param_local._4_4_ = 1;
        }
      }
      else {
        this_00 = (AWeapon *)AActor::FindInventory(this,type,false);
        if ((this_00 == (AWeapon *)0x0) ||
           (bVar1 = DObject::IsKindOf((DObject *)this_00,AWeapon::RegistrationInfo.MyClass), !bVar1)
           ) {
          if (bVar3) {
            if (numret < 1) {
              param_local._4_4_ = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0xc33,
                              "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetInt(ret,0);
              param_local._4_4_ = 1;
            }
          }
          else {
            APlayerPawn::PickNewWeapon(this->player->mo,(PClassAmmo *)0x0);
            if (numret < 1) {
              param_local._4_4_ = 0;
            }
            else {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0xc2f,
                              "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetInt(ret,1);
              param_local._4_4_ = 1;
            }
          }
        }
        else {
          if (this->player->ReadyWeapon != this_00) {
            this->player->PendingWeapon = this_00;
          }
          if (numret < 1) {
            param_local._4_4_ = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0xc27,
                            "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,1);
            param_local._4_4_ = 1;
          }
        }
      }
      return param_local._4_4_;
    }
    __assert_fail("cls == NULL || cls->IsDescendantOf(RUNTIME_CLASS(AWeapon))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc15,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xc15,
                "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectWeapon)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(cls, AWeapon);
	PARAM_INT_DEF(flags);

	bool selectPriority = !!(flags & SWF_SELECTPRIORITY);

	if ((!selectPriority && cls == NULL) || self->player == NULL)
	{
		ACTION_RETURN_BOOL(false);
	}

	AWeapon *weaponitem = static_cast<AWeapon*>(self->FindInventory(cls));

	if (weaponitem != NULL && weaponitem->IsKindOf(RUNTIME_CLASS(AWeapon)))
	{
		if (self->player->ReadyWeapon != weaponitem)
		{
			self->player->PendingWeapon = weaponitem;
		}
		ACTION_RETURN_BOOL(true);
	}
	else if (selectPriority)
	{
		// [XA] if the named weapon cannot be found (or is a dummy like 'None'),
		//      select the next highest priority weapon. This is basically
		//      the same as A_CheckReload minus the ammo check. Handy.
		self->player->mo->PickNewWeapon(NULL);
		ACTION_RETURN_BOOL(true);
	}
	else
	{
		ACTION_RETURN_BOOL(false);
	}
}